

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_file_create_block
              (BigFile *bf,BigBlock *block,char *blockname,char *dtype,int nmemb,int Nfile,
              size_t *fsize)

{
  int iVar1;
  char *basename;
  
  iVar1 = _big_file_mksubdir_r(bf->basename,blockname);
  if (iVar1 == 0) {
    basename = _path_join(bf->basename,blockname);
    iVar1 = _big_block_create(block,basename,dtype,nmemb,Nfile,fsize);
    free(basename);
  }
  else {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x124);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
big_file_create_block(BigFile * bf, BigBlock * block, const char * blockname, const char * dtype, int nmemb, int Nfile, const size_t fsize[])
{
    RAISEIF(0 != _big_file_mksubdir_r(bf->basename, blockname),
            ex_subdir,
            NULL);
    char * basename = _path_join(bf->basename, blockname);
    int rt = _big_block_create(block, basename, dtype, nmemb, Nfile, fsize);
    free(basename);
    return rt;
ex_subdir:
    return -1;
}